

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

MarketDataRequest * __thiscall
Application::queryMarketDataRequest50(MarketDataRequest *__return_storage_ptr__,Application *this)

{
  undefined1 *puVar1;
  ostream *poVar2;
  int iVar3;
  NoMDEntryTypes marketDataEntryGroup;
  Symbol symbol;
  MDReqID mdReqID;
  MarketDepth marketDepth;
  SubscriptionRequestType subType;
  MDEntryType mdEntryType;
  NoRelatedSym symbolGroup;
  long *local_2e8;
  long local_2e0;
  long local_2d8 [2];
  NoMDEntryTypes local_2c8;
  undefined1 local_250 [16];
  _Alloc_hider local_240;
  char local_230 [16];
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  field_metrics local_200;
  undefined1 local_1f8 [16];
  _Alloc_hider local_1e8;
  char local_1d8 [16];
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  field_metrics local_1a8;
  FieldBase local_1a0;
  FieldBase local_148;
  FieldBase local_f0;
  NoRelatedSym local_98;
  
  puVar1 = &local_2c8.super_Group.field_0x10;
  local_2c8.super_Group._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"MARKETDATAID","");
  local_1f8._0_8_ = &PTR__FieldBase_00151e98;
  local_1f8._8_4_ = 0x106;
  local_1e8._M_p = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_2c8.super_Group._0_8_,
             (undefined1 *)(local_2c8.super_Group._0_8_ + local_2c8.super_Group._8_8_));
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_1a8.m_length = 0;
  local_1a8.m_checksum = 0;
  local_1f8._0_8_ = &PTR__FieldBase_00152718;
  if ((undefined1 *)local_2c8.super_Group._0_8_ != puVar1) {
    operator_delete((void *)local_2c8.super_Group._0_8_,local_2c8.super_Group._16_8_ + 1);
  }
  FIX::CharField::CharField((CharField *)&local_148,0x107,'0');
  local_148._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00152750;
  FIX::IntField::IntField((IntField *)&local_1a0,0x108,0);
  local_1a0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00152788;
  FIX50::MarketDataRequest::NoMDEntryTypes::NoMDEntryTypes(&local_2c8);
  FIX::CharField::CharField((CharField *)&local_f0,0x10d,'0');
  local_f0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00152868;
  FIX::FieldMap::setField((FieldMap *)&local_2c8,&local_f0,true);
  FIX50::MarketDataRequest::NoRelatedSym::NoRelatedSym(&local_98);
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"LNUX","");
  local_250._0_8_ = &PTR__FieldBase_00151e98;
  local_250._8_4_ = 0x37;
  local_240._M_p = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,local_2e8,(long)local_2e8 + local_2e0);
  local_220._M_p = (pointer)&local_210;
  local_218 = 0;
  local_210._M_local_buf[0] = '\0';
  local_200.m_length = 0;
  local_200.m_checksum = 0;
  local_250._0_8_ = &PTR__FieldBase_001528d8;
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  FIX::FieldMap::setField((FieldMap *)&local_98,(FieldBase *)local_250,true);
  FIX50::MarketDataRequest::MarketDataRequest
            (__return_storage_ptr__,(MDReqID *)local_1f8,(SubscriptionRequestType *)&local_148,
             (MarketDepth *)&local_1a0);
  iVar3 = (int)__return_storage_ptr__;
  FIX::FieldMap::addGroup
            (iVar3,(FieldMap *)(ulong)(uint)local_2c8.super_Group.m_field,SUB81(&local_2c8,0));
  FIX::FieldMap::addGroup
            (iVar3,(FieldMap *)(ulong)(uint)local_98.super_Group.m_field,SUB81(&local_98,0));
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  FIX::Message::toXML_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_2e8,local_2e0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  FIX::Message::toString_abi_cxx11_((int)&local_2e8,iVar3,8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_2e8,local_2e0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_250);
  FIX::FieldMap::~FieldMap((FieldMap *)&local_98);
  FIX::FieldBase::~FieldBase(&local_f0);
  FIX::FieldMap::~FieldMap((FieldMap *)&local_2c8);
  FIX::FieldBase::~FieldBase(&local_1a0);
  FIX::FieldBase::~FieldBase(&local_148);
  FIX::FieldBase::~FieldBase((FieldBase *)local_1f8);
  return __return_storage_ptr__;
}

Assistant:

FIX50::MarketDataRequest Application::queryMarketDataRequest50() {
  FIX::MDReqID mdReqID("MARKETDATAID");
  FIX::SubscriptionRequestType subType(FIX::SubscriptionRequestType_SNAPSHOT);
  FIX::MarketDepth marketDepth(0);

  FIX50::MarketDataRequest::NoMDEntryTypes marketDataEntryGroup;
  FIX::MDEntryType mdEntryType(FIX::MDEntryType_BID);
  marketDataEntryGroup.set(mdEntryType);

  FIX50::MarketDataRequest::NoRelatedSym symbolGroup;
  FIX::Symbol symbol("LNUX");
  symbolGroup.set(symbol);

  FIX50::MarketDataRequest message(mdReqID, subType, marketDepth);
  message.addGroup(marketDataEntryGroup);
  message.addGroup(symbolGroup);

  queryHeader(message.getHeader());

  std::cout << message.toXML() << std::endl;
  std::cout << message.toString() << std::endl;

  return message;
}